

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oss.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_225155::OSSPlayback::start(OSSPlayback *this)

{
  _Mem_fn<int_((anonymous_namespace)::OSSPlayback::*)()> *this_00;
  atomic<bool> *in_RDI;
  exception *e;
  thread *in_stack_ffffffffffffff98;
  memory_order in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  code *__args;
  _Mem_fn<int_((anonymous_namespace)::OSSPlayback::*)()> *__f;
  
  std::atomic<bool>::store
            (in_RDI,SUB41((uint)in_stack_ffffffffffffffa4 >> 0x18,0),in_stack_ffffffffffffffa0);
  __args = mixerProc;
  __f = (_Mem_fn<int_((anonymous_namespace)::OSSPlayback::*)()> *)0x0;
  this_00 = std::mem_fn<int(),(anonymous_namespace)::OSSPlayback>
                      ((offset_in_OSSPlayback_to_subr)in_RDI);
  std::thread::
  thread<std::_Mem_fn<int((anonymous_namespace)::OSSPlayback::*)()>,(anonymous_namespace)::OSSPlayback*,void>
            ((thread *)this_00,__f,(OSSPlayback **)__args);
  std::thread::operator=
            ((thread *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98);
  std::thread::~thread((thread *)0x238a51);
  return;
}

Assistant:

void OSSPlayback::start()
{
    try {
        mKillNow.store(false, std::memory_order_release);
        mThread = std::thread{std::mem_fn(&OSSPlayback::mixerProc), this};
    }
    catch(std::exception& e) {
        throw al::backend_exception{ALC_INVALID_DEVICE, "Failed to start mixing thread: %s",
            e.what()};
    }
}